

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86_avx512::forward_inplace
          (HardSwish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  undefined1 auVar12 [24];
  int iVar13;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  __m128 _ans_2;
  __m128 _p_2;
  __m128 _one;
  __m128 _zero;
  __m256 _ans_1;
  __m256 _p_1;
  __m256 _one_avx;
  __m256 _zero_avx;
  __m512 _ans;
  __m512 _p;
  __m512 _one_avx512;
  __m512 _zero_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  int local_a10;
  undefined1 (*local_9b8) [64];
  int local_9ac;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  lVar11 = in_RSI[7];
  iVar13 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
           (int)in_RSI[3];
  for (local_9ac = 0; local_9ac < (int)lVar11; local_9ac = local_9ac + 1) {
    local_9b8 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_9ac * in_RSI[2]);
    local_a10 = 0;
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    for (; local_a10 + 0xf < iVar13; local_a10 = local_a10 + 0x10) {
      auVar15 = vbroadcastss_avx512f
                          (ZEXT416(*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)));
      auVar16 = vbroadcastss_avx512f
                          (ZEXT416(*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)));
      auVar15 = vfmadd213ps_avx512f(auVar16,*local_9b8,auVar15);
      auVar15 = vmaxps_avx512f(auVar15,ZEXT1664(ZEXT816(0)));
      auVar15 = vminps_avx512f(auVar15,auVar14);
      auVar15 = vmulps_avx512f(auVar15,*local_9b8);
      local_b40 = auVar15._0_8_;
      uStack_b38 = auVar15._8_8_;
      uStack_b30 = auVar15._16_8_;
      uStack_b28 = auVar15._24_8_;
      uStack_b20 = auVar15._32_8_;
      uStack_b18 = auVar15._40_8_;
      uStack_b10 = auVar15._48_8_;
      uStack_b08 = auVar15._56_8_;
      *(undefined8 *)*local_9b8 = local_b40;
      *(undefined8 *)(*local_9b8 + 8) = uStack_b38;
      *(undefined8 *)(*local_9b8 + 0x10) = uStack_b30;
      *(undefined8 *)(*local_9b8 + 0x18) = uStack_b28;
      *(undefined8 *)(*local_9b8 + 0x20) = uStack_b20;
      *(undefined8 *)(*local_9b8 + 0x28) = uStack_b18;
      *(undefined8 *)(*local_9b8 + 0x30) = uStack_b10;
      *(undefined8 *)(*local_9b8 + 0x38) = uStack_b08;
      local_9b8 = local_9b8 + 1;
    }
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
    uStack_170 = auVar4._0_8_;
    uStack_168 = auVar4._8_8_;
    for (; local_a10 + 7 < iVar13; local_a10 = local_a10 + 8) {
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_130 = auVar6._0_8_;
      uStack_128 = auVar6._8_8_;
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
      uStack_f0 = auVar6._0_8_;
      uStack_e8 = auVar6._8_8_;
      auVar10._16_8_ = uStack_f0;
      auVar10._0_16_ = auVar7;
      auVar10._24_8_ = uStack_e8;
      auVar8._16_8_ = uStack_130;
      auVar8._0_16_ = auVar4;
      auVar8._24_8_ = uStack_128;
      auVar4 = vfmadd213ps_fma(auVar10,*(undefined1 (*) [32])*local_9b8,auVar8);
      auVar8 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(ZEXT816(0)));
      auVar9._16_8_ = uStack_170;
      auVar9._0_16_ = auVar5;
      auVar9._24_8_ = uStack_168;
      auVar8 = vminps_avx(auVar8,auVar9);
      local_3a0 = auVar8._0_4_;
      fStack_39c = auVar8._4_4_;
      fStack_398 = auVar8._8_4_;
      fStack_394 = auVar8._12_4_;
      fStack_390 = auVar8._16_4_;
      fStack_38c = auVar8._20_4_;
      fStack_388 = auVar8._24_4_;
      uStack_384 = auVar8._28_4_;
      local_3c0 = (float)*(undefined8 *)*local_9b8;
      fStack_3bc = (float)((ulong)*(undefined8 *)*local_9b8 >> 0x20);
      fStack_3b8 = (float)*(undefined8 *)(*local_9b8 + 8);
      fStack_3b4 = (float)((ulong)*(undefined8 *)(*local_9b8 + 8) >> 0x20);
      fStack_3b0 = (float)*(undefined8 *)(*local_9b8 + 0x10);
      fStack_3ac = (float)((ulong)*(undefined8 *)(*local_9b8 + 0x10) >> 0x20);
      fStack_3a8 = (float)*(undefined8 *)(*local_9b8 + 0x18);
      local_bc0 = CONCAT44(fStack_39c * fStack_3bc,local_3a0 * local_3c0);
      uStack_bb8._0_4_ = fStack_398 * fStack_3b8;
      uStack_bb8._4_4_ = fStack_394 * fStack_3b4;
      uStack_bb0._0_4_ = fStack_390 * fStack_3b0;
      uStack_bb0._4_4_ = fStack_38c * fStack_3ac;
      auVar12 = _local_bc0;
      uStack_ba8._0_4_ = fStack_388 * fStack_3a8;
      uStack_ba8._4_4_ = uStack_384;
      auVar8 = _local_bc0;
      uStack_bb0 = auVar12._16_8_;
      uStack_ba8 = auVar8._24_8_;
      *(undefined8 *)*local_9b8 = local_bc0;
      *(undefined8 *)(*local_9b8 + 8) = uStack_bb8;
      *(undefined8 *)(*local_9b8 + 0x10) = uStack_bb0;
      *(undefined8 *)(*local_9b8 + 0x18) = uStack_ba8;
      local_9b8 = (undefined1 (*) [64])(*local_9b8 + 0x20);
    }
    for (; local_a10 + 3 < iVar13; local_a10 = local_a10 + 4) {
      fVar2 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      fVar3 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_280 = (float)*(undefined8 *)*local_9b8;
      fStack_27c = (float)((ulong)*(undefined8 *)*local_9b8 >> 0x20);
      fStack_278 = (float)*(undefined8 *)(*local_9b8 + 8);
      fStack_274 = (float)((ulong)*(undefined8 *)(*local_9b8 + 8) >> 0x20);
      local_c00 = CONCAT44(fStack_27c * fVar3 + fVar2,local_280 * fVar3 + fVar2);
      uStack_bf8._0_4_ = fStack_278 * fVar3 + fVar2;
      uStack_bf8._4_4_ = fStack_274 * fVar3 + fVar2;
      auVar4._8_8_ = uStack_bf8;
      auVar4._0_8_ = local_c00;
      auVar4 = vmaxps_avx(auVar4,ZEXT816(0));
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar4 = vminps_avx(auVar4,auVar5);
      local_2a0 = auVar4._0_4_;
      fStack_29c = auVar4._4_4_;
      fStack_298 = auVar4._8_4_;
      fStack_294 = auVar4._12_4_;
      local_c00 = CONCAT44(fStack_29c * fStack_27c,local_2a0 * local_280);
      uStack_bf8._0_4_ = fStack_298 * fStack_278;
      uStack_bf8._4_4_ = fStack_294 * fStack_274;
      *(undefined8 *)*local_9b8 = local_c00;
      *(undefined8 *)(*local_9b8 + 8) = uStack_bf8;
      local_9b8 = (undefined1 (*) [64])(*local_9b8 + 0x10);
    }
    for (; local_a10 < iVar13; local_a10 = local_a10 + 1) {
      if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *(float *)*local_9b8) {
        if (*(float *)*local_9b8 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) {
          *(float *)*local_9b8 =
               *(float *)*local_9b8 *
               (*(float *)*local_9b8 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
               + *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
        }
      }
      else {
        *(undefined4 *)*local_9b8 = 0;
      }
      local_9b8 = (undefined1 (*) [64])(*local_9b8 + 4);
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}